

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<12,_12,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  Matrix<float,_3,_4> *mat;
  Matrix<float,_3,_4> *mat_00;
  long lVar5;
  undefined8 *puVar6;
  undefined4 uVar7;
  Vector<float,_3> res_3;
  Vector<float,_3> res;
  Vector<float,_3> res_5;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  Mat4x3 m;
  float afStack_e8 [6];
  float local_d0 [2];
  undefined8 local_c8;
  undefined4 local_c0;
  float local_b8 [4];
  float local_a8 [4];
  Matrix<float,_3,_4> local_98;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  Matrix<float,_3,_4> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_68;
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar5) = uVar7;
        lVar5 = lVar5 + 0xc;
      } while (lVar5 != 0x30);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar2 = lVar2 + 0xc;
    } while (lVar4 != 3);
    local_68 = *(undefined8 *)evalCtx->in[0].m_data;
    local_58 = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    uStack_60 = CONCAT44(evalCtx->in[1].m_data[0],evalCtx->in[0].m_data[2]);
    uStack_50 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_40 = *(undefined8 *)(evalCtx->in[3].m_data + 1);
    local_48 = CONCAT44(evalCtx->in[3].m_data[0],evalCtx->in[2].m_data[2]);
    mat = (Matrix<float,_3,_4> *)0x3;
  }
  else {
    puVar1 = &local_68;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    puVar3 = &s_constInMat4x3;
    mat = (Matrix<float,_3,_4> *)0x0;
    do {
      lVar2 = 0;
      puVar6 = puVar1;
      do {
        *(undefined4 *)puVar6 = puVar3[lVar2];
        lVar2 = lVar2 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + 0xc);
      } while (lVar2 != 4);
      mat = (Matrix<float,_3,_4> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 4;
    } while (mat != (Matrix<float,_3,_4> *)0x3);
  }
  decrement<float,3,4>(&local_38,(MatrixCaseUtils *)&local_68,mat);
  local_c8 = (ulong)local_c8._4_4_ << 0x20;
  local_d0[0] = 0.0;
  local_d0[1] = 0.0;
  lVar2 = 0;
  do {
    local_d0[lVar2] =
         local_38.m_data.m_data[0].m_data[lVar2] + local_38.m_data.m_data[1].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_98.m_data.m_data[0].m_data[2] = 0.0;
  local_98.m_data.m_data[0].m_data[0] = 0.0;
  local_98.m_data.m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  do {
    local_98.m_data.m_data[0].m_data[lVar2] =
         local_d0[lVar2] + local_38.m_data.m_data[2].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  lVar2 = 0;
  do {
    local_a8[lVar2] =
         local_98.m_data.m_data[0].m_data[lVar2] + local_38.m_data.m_data[3].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  decrement<float,3,4>(&local_98,(MatrixCaseUtils *)&local_68,mat_00);
  afStack_e8[4] = 0.0;
  afStack_e8[2] = 0.0;
  afStack_e8[3] = 0.0;
  lVar2 = 0;
  do {
    afStack_e8[lVar2 + 2] =
         local_98.m_data.m_data[0].m_data[lVar2] + local_98.m_data.m_data[1].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c8 = local_c8 & 0xffffffff00000000;
  local_d0[0] = 0.0;
  local_d0[1] = 0.0;
  lVar2 = 0;
  do {
    local_d0[lVar2] = afStack_e8[lVar2 + 2] + local_98.m_data.m_data[2].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_b8[2] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  lVar2 = 0;
  do {
    local_b8[lVar2] = local_d0[lVar2] + local_98.m_data.m_data[3].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_e8[2] = 0.0;
  afStack_e8[3] = 0.0;
  afStack_e8[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_e8[lVar2 + 2] = local_a8[lVar2] + local_b8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c8 = 0x100000000;
  local_c0 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_d0[lVar2]] = afStack_e8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}